

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffcmap.c
# Opt level: O0

FT_UInt32 cff_cmap_encoding_char_next(CFF_CMapStd cmap,FT_UInt32 *pchar_code)

{
  uint local_24;
  FT_UInt code;
  FT_UInt32 char_code;
  FT_UInt result;
  FT_UInt32 *pchar_code_local;
  CFF_CMapStd cmap_local;
  
  code = 0;
  local_24 = *pchar_code;
  *pchar_code = 0;
  if (local_24 < 0xff) {
    do {
      local_24 = local_24 + 1;
      if (0xff < local_24) {
        return code;
      }
      code = (FT_UInt)cmap->gids[local_24];
    } while (code == 0);
    *pchar_code = local_24;
  }
  return code;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  cff_cmap_encoding_char_next( CFF_CMapStd   cmap,
                               FT_UInt32    *pchar_code )
  {
    FT_UInt    result    = 0;
    FT_UInt32  char_code = *pchar_code;


    *pchar_code = 0;

    if ( char_code < 255 )
    {
      FT_UInt  code = (FT_UInt)(char_code + 1);


      for (;;)
      {
        if ( code >= 256 )
          break;

        result = cmap->gids[code];
        if ( result != 0 )
        {
          *pchar_code = code;
          break;
        }

        code++;
      }
    }
    return result;
  }